

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_function_list.cpp
# Opt level: O3

bool __thiscall ON_FunctionList::CallFunctions(ON_FunctionList *this,bool bFirstToLast)

{
  bool bVar1;
  void *pvVar2;
  undefined8 *puVar3;
  
  bVar1 = ON_Lock::GetDefaultLock(&this->m_lock);
  if (bVar1) {
    if (bFirstToLast) {
      for (pvVar2 = this->m_head; pvVar2 != (void *)0x0; pvVar2 = *(void **)((long)pvVar2 + 8)) {
        (**(code **)((long)pvVar2 + 0x10))(*(undefined8 *)((long)pvVar2 + 0x18));
      }
    }
    else {
      for (puVar3 = (undefined8 *)this->m_tail; puVar3 != (undefined8 *)0x0;
          puVar3 = (undefined8 *)*puVar3) {
        (*(code *)puVar3[2])(puVar3[3]);
      }
    }
    ON_Lock::ReturnDefaultLock(&this->m_lock);
  }
  return bVar1;
}

Assistant:

bool ON_FunctionList::CallFunctions(
  bool bFirstToLast
  )
{
  if ( false == m_lock.GetDefaultLock() )
    return false;

  if ( bFirstToLast )
  {
    for ( struct tagFunctionItem* item = (struct tagFunctionItem*)m_head; item; item = item->m_next )
    {
      item->m_function(item->m_function_parameter);
    }
  }
  else
  {
    for ( struct tagFunctionItem* item = (struct tagFunctionItem*)m_tail; item; item = item->m_prev )
    {
      item->m_function(item->m_function_parameter);
    }
  }
    
  m_lock.ReturnDefaultLock();

  return true;
}